

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

token * attribute_context(dmr_C *C,token *token,symbol *attr,decl_state *ctx)

{
  undefined8 *ptr;
  token *ptVar1;
  longlong lVar2;
  long lVar3;
  int iVar4;
  expression *local_58;
  expression *args [3];
  expression *local_38;
  expression *expr;
  
  iVar4 = 0;
  ptr = (undefined8 *)dmrC_allocator_allocate(&C->S->context_allocator,0);
  ptVar1 = dmrC_expect_token(C,token,0x28,"after context attribute");
  for (; (((ulong)ptVar1->pos & 0x3f) != 0x11 || ((ptVar1->field_2).special != 0x29));
      ptVar1 = ptVar1->next) {
    local_38 = (expression *)0x0;
    ptVar1 = dmrC_conditional_expression(C,ptVar1,&local_38);
    if (local_38 == (expression *)0x0) break;
    if (iVar4 < 3) {
      lVar3 = (long)iVar4;
      iVar4 = iVar4 + 1;
      args[lVar3 + -1] = local_38;
    }
    if ((((ulong)ptVar1->pos & 0x3f) != 0x11) || ((ptVar1->field_2).special != 0x2c)) break;
  }
  switch(iVar4) {
  case 0:
    dmrC_sparse_error(C,ptVar1->pos,"expected context input/output values");
    goto LAB_0011c7a5;
  case 1:
    lVar2 = dmrC_get_expression_value(C,local_58);
    *(int *)(ptr + 1) = (int)lVar2;
    break;
  case 2:
    lVar2 = dmrC_get_expression_value(C,local_58);
    *(int *)(ptr + 1) = (int)lVar2;
    args[1] = args[0];
    goto LAB_0011c773;
  case 3:
    *ptr = local_58;
    lVar2 = dmrC_get_expression_value(C,args[0]);
    *(int *)(ptr + 1) = (int)lVar2;
LAB_0011c773:
    lVar2 = dmrC_get_expression_value(C,args[1]);
    *(int *)((long)ptr + 0xc) = (int)lVar2;
  }
  ptrlist_add((ptr_list **)&(ctx->ctype).contexts,ptr,&C->ptrlist_allocator);
LAB_0011c7a5:
  ptVar1 = dmrC_expect_token(C,ptVar1,0x29,"after context attribute");
  return ptVar1;
}

Assistant:

static struct token *attribute_context(struct dmr_C *C, struct token *token, struct symbol *attr, struct decl_state *ctx)
{
        (void) attr;
	struct context *context = (struct context *)dmrC_allocator_allocate(&C->S->context_allocator, 0);
	struct expression *args[3];
	int argc = 0;

	token = dmrC_expect_token(C, token, '(', "after context attribute");
	while (!dmrC_match_op(token, ')')) {
		struct expression *expr = NULL;
		token = dmrC_conditional_expression(C, token, &expr);
		if (!expr)
			break;
		if (argc < 3)
			args[argc++] = expr;
		if (!dmrC_match_op(token, ','))
			break;
		token = token->next;
	}

	switch(argc) {
	case 0:
		dmrC_sparse_error(C, token->pos, "expected context input/output values");
		break;
	case 1:
		context->in = (unsigned int)dmrC_get_expression_value(C, args[0]);
		break;
	case 2:
		context->in = (unsigned int)dmrC_get_expression_value(C, args[0]);
		context->out = (unsigned int)dmrC_get_expression_value(C, args[1]);
		break;
	case 3:
		context->context_expr = args[0];
		context->in = (unsigned int)dmrC_get_expression_value(C, args[1]);
		context->out = (unsigned int)dmrC_get_expression_value(C, args[2]);
		break;
	}

	if (argc)
		dmrC_add_context(C, &ctx->ctype.contexts, context);

	token = dmrC_expect_token(C, token, ')', "after context attribute");
	return token;
}